

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

Variant * Jinx::operator+(Variant *__return_storage_ptr__,Variant *left,Variant *right)

{
  ValueType VVar1;
  int64_t iVar2;
  int64_t iVar3;
  char *format;
  double dVar4;
  double dVar5;
  String local_78;
  String local_58;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_38;
  
  VVar1 = left->m_type;
  if (VVar1 == Number) {
    if (right->m_type - Number < 2) {
LAB_00112931:
      __return_storage_ptr__->m_type = Null;
      dVar4 = Variant::GetNumber(left);
      dVar5 = Variant::GetNumber(right);
      Variant::SetNumber(__return_storage_ptr__,dVar4 + dVar5);
      return __return_storage_ptr__;
    }
  }
  else {
    if (VVar1 != Integer) {
      if (VVar1 == String) {
        __return_storage_ptr__->m_type = Null;
        Variant::GetString_abi_cxx11_(&local_58,left);
        Variant::GetString_abi_cxx11_(&local_78,right);
        std::operator+(&local_38,&local_58,&local_78);
        Variant::SetString(__return_storage_ptr__,&local_38);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string(&local_38);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string(&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string(&local_58);
        return __return_storage_ptr__;
      }
      format = "Invalid left operand for addition";
      goto LAB_00112972;
    }
    if (right->m_type == Number) goto LAB_00112931;
    if (right->m_type == Integer) {
      __return_storage_ptr__->m_type = Null;
      iVar2 = Variant::GetInteger(left);
      iVar3 = Variant::GetInteger(right);
      Variant::SetInteger(__return_storage_ptr__,iVar3 + iVar2);
      return __return_storage_ptr__;
    }
  }
  format = "Invalid right operand for addition";
LAB_00112972:
  Impl::LogWriteLine(Error,format);
  __return_storage_ptr__->m_type = Null;
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant operator + (const Variant & left, const Variant & right)
	{
		if (left.GetType() == ValueType::String)
		{
			Variant result;
			result.SetString(left.GetString() + right.GetString());
			return result;
		}
		if (left.GetType() != ValueType::Number && left.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid left operand for addition");
			return Variant();
		}
		if (right.GetType() != ValueType::Number && right.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid right operand for addition");
			return Variant();
		}
		if (left.GetType() == ValueType::Integer && right.GetType() == ValueType::Integer)
		{
			Variant result;
			result.SetInteger(left.GetInteger() + right.GetInteger());
			return result;
		}
		else
		{
			Variant result;
			result.SetNumber(left.GetNumber() + right.GetNumber());
			return result;
		}
	}